

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::log_internal::LogMessageQuietlyFatal::LogMessageQuietlyFatal
          (LogMessageQuietlyFatal *this,Nonnull<const_char_*> file,int line,
          Nonnull<const_char_*> failure_msg)

{
  LogMessage *pLVar1;
  Nonnull<const_char_*> local_28;
  Nonnull<const_char_*> failure_msg_local;
  Nonnull<const_char_*> pcStack_18;
  int line_local;
  Nonnull<const_char_*> file_local;
  LogMessageQuietlyFatal *this_local;
  
  local_28 = failure_msg;
  failure_msg_local._4_4_ = line;
  pcStack_18 = file;
  file_local = (Nonnull<const_char_*>)this;
  LogMessageQuietlyFatal(this,file,line);
  pLVar1 = LogMessage::operator<<(&this->super_LogMessage,(char (*) [15])"Check failed: ");
  pLVar1 = LogMessage::operator<<<const_char_*,_0>(pLVar1,&local_28);
  LogMessage::operator<<(pLVar1,(char (*) [2])0x6d58ee);
  return;
}

Assistant:

LogMessageQuietlyFatal::LogMessageQuietlyFatal(
    absl::Nonnull<const char*> file, int line,
    absl::Nonnull<const char*> failure_msg)
    : LogMessageQuietlyFatal(file, line) {
  *this << "Check failed: " << failure_msg << " ";
}